

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

void build_path(char *fullpathbuf,size_t fullpathbuflen,char *path,char *filename,int canon)

{
  int iVar1;
  char *pcVar2;
  char *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  int in_R8D;
  bool bVar3;
  int add_sep;
  size_t flen;
  size_t plen;
  undefined4 in_stack_00000020;
  char *in_stack_ffffffffffffffb8;
  size_t local_38;
  ulong local_30;
  
  local_30 = strlen(in_RDX);
  iVar1 = os_is_file_absolute(in_stack_ffffffffffffffb8);
  if (iVar1 != 0) {
    local_30 = 0;
  }
  bVar3 = false;
  if ((local_30 != 0) && (bVar3 = false, in_RDX[local_30] == '\0')) {
    bVar3 = true;
    if ((in_RDX[local_30 - 1] != '/') && (bVar3 = false, in_RDX[local_30 - 1] != '\0')) {
      pcVar2 = strchr("",(int)in_RDX[local_30 - 1]);
      bVar3 = pcVar2 != (char *)0x0;
    }
    bVar3 = (bool)(bVar3 ^ 1);
  }
  if (in_RSI - 1 < local_30) {
    local_30 = in_RSI - 1;
  }
  memcpy(in_RDI,in_RDX,local_30);
  if ((bVar3) && (local_30 + 2 < in_RSI)) {
    *(undefined1 *)((long)in_RDI + local_30) = 0x2f;
    local_30 = local_30 + 1;
  }
  local_38 = strlen(in_RCX);
  if ((in_RSI - local_30) - 1 < local_38) {
    local_38 = (in_RSI - local_30) - 1;
  }
  memcpy((void *)((long)in_RDI + local_30),in_RCX,local_38);
  *(undefined1 *)((long)in_RDI + local_30 + local_38) = 0;
  if (in_R8D != 0) {
    canonicalize_path((char *)CONCAT44(canon,in_stack_00000020));
  }
  return;
}

Assistant:

static void build_path(char *fullpathbuf, size_t fullpathbuflen,
                       const char *path, const char *filename, int canon)
{
    size_t plen, flen;
    int add_sep;

    /* presume we'll copy the entire path */
    plen = strlen(path);

#ifdef MSDOS
    /*
     *   On DOS, there's a special case involving root paths without drive
     *   letters.  If the filename starts with a slash, but doesn't look like
     *   a UNC-style name (\\MACHINE\NAME), it's an absolute path on a
     *   relative drive.  This means that we need to copy the drive letter or
     *   UNC prefix from 'path' and add the root path from 'filename'.
     */
    if ((filename[0] == '\\' || filename[0] == '/')
        && !(filename[1] == '\\' && filename[1] == '/'))
    {
        const char *p;
        
        /* 
         *   'filename' is a root path without a drive letter.  Determine if
         *   'path' starts with a drive letter or a UNC path. 
         */
        if (isalpha(path[0]) && path[1] == ':')
        {
            /* drive letter */
            plen = 2;
        }
        else if ((path[0] == '\\' || path[0] == '/')
                 && (path[1] == '\\' || path[1] == '/'))
        {
            /* 
             *   UNC-style name - copy the whole \\MACHINE\PATH part.  Look
             *   for the first path separator after the machine name... 
             */
            for (p = path + 2 ; *p != '\0' && *p != '\\' && *p != '/' ; ++p) ;

            /* ...now look for the next path separator after that */
            if (*p != '\0')
                for (++p ; *p != '\0' && *p != '\\' && *p != '/' ; ++p) ;

            /* copy everything up to but not including the second separator */
            plen = p - path;
        }
        else
        {
            /* 
             *   we have a root path on the filename side, but no drive
             *   letter or UNC prefix on the path side, so there's nothing to
             *   add to the filename 
             */
            plen = 0;
        }
    }

    /*
     *   There's a second special case for DOS.  If the filename has a drive
     *   letter with a relative path (e.g., "d:asdf" - no leading backslash),
     *   we can't apply any of the path.  This sort of path isn't absolute,
     *   in that it depends upon the working directory on the drive, but it's
     *   also not relative, in that it does specify a full directory rather
     *   than a path fragment to add to a root path.
     */
    if (isalpha(filename[0]) && filename[1] == ':'
        && filename[2] != '\\' && filename[2] != '/')
    {
        /* the file has a drive letter - we can't combine it with the path */
        plen = 0;
    }
#endif

    /* if the filename is an absolute path already, leave it as is */
    if (os_is_file_absolute(filename))
        plen = 0;

    /* 
     *   Note whether we need to add a separator.  If the path prefix ends in
     *   a separator, don't add another; otherwise, add the standard system
     *   separator character.
     *   
     *   Don't add a separator if the path is completely empty, since this
     *   simply means that we want to use the current directory.  
     */
    add_sep = (plen != 0 && path[plen] == '\0' && !ispathchar(path[plen-1]));
    
    /* copy the path to the full path buffer, limiting to the buffer length */
    if (plen > fullpathbuflen - 1)
        plen = fullpathbuflen - 1;
    memcpy(fullpathbuf, path, plen);

    /* add the path separator if necessary (and if there's room) */
    if (add_sep && plen + 2 < fullpathbuflen)
        fullpathbuf[plen++] = OSPATHCHAR;

    /* add the filename after the path, if there's room */
    flen = strlen(filename);
    if (flen > fullpathbuflen - plen - 1)
        flen = fullpathbuflen - plen - 1;
    memcpy(fullpathbuf + plen, filename, flen);

    /* add a null terminator */
    fullpathbuf[plen + flen] = '\0';

    /* if desired, canonicalize the result */
    if (canon)
        canonicalize_path(fullpathbuf);
}